

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QFileSystemEntry *
QFileSystemEngine::getLinkTarget(QFileSystemEntry *link,QFileSystemMetaData *data)

{
  bool bVar1;
  int *piVar2;
  qsizetype qVar3;
  char *pcVar4;
  QFileSystemMetaData *in_RDX;
  QFileSystemEntry *in_RSI;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QDir parent;
  QString ret;
  QByteArray s;
  undefined4 in_stack_fffffffffffffe08;
  MetaDataFlag in_stack_fffffffffffffe0c;
  QFileSystemEntry *in_stack_fffffffffffffe10;
  QFileSystemMetaData *in_stack_fffffffffffffe18;
  QFileSystemMetaData *pQVar5;
  QChar c;
  QFileSystemEntry *this;
  QFileSystemMetaData *data_00;
  QFileSystemEntry *entry;
  QChar local_1a2 [16];
  undefined2 local_182;
  QChar local_14a [15];
  QChar local_12c;
  QChar local_12a [25];
  undefined8 local_f8;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> what;
  QByteArray local_b8 [7];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar1 = QFileSystemEntry::isEmpty(in_stack_fffffffffffffe10);
  if (bVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    QFileSystemEntry::QFileSystemEntry
              (in_stack_fffffffffffffe10,
               (QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  }
  else {
    bVar1 = qIsFilenameBroken(in_stack_fffffffffffffe10);
    if (bVar1) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      QFileSystemEntry::QFileSystemEntry
                (in_stack_fffffffffffffe10,
                 (QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    }
    else {
      local_b8[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_b8[0].d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      local_b8[0].d.size = -0x5555555555555556;
      QFileSystemEntry::nativeFilePath((QFileSystemEntry *)in_stack_fffffffffffffe18);
      QByteArray::constData((QByteArray *)0x16b57a);
      qt_readlink((char *)in_RSI);
      QByteArray::~QByteArray((QByteArray *)0x16b597);
      qVar3 = QByteArray::size(local_b8);
      if (qVar3 < 1) {
        QFileSystemEntry::QFileSystemEntry(in_stack_fffffffffffffe10);
      }
      else {
        what.i = 0xaaaaaaaa;
        QString::QString((QString *)0x16b5e8);
        pQVar5 = in_RDX;
        QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
                  ((QFlags<QFileSystemMetaData::MetaDataFlag> *)in_stack_fffffffffffffe10,
                   in_stack_fffffffffffffe0c);
        bVar1 = QFileSystemMetaData::hasFlags
                          ((QFileSystemMetaData *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                           (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
                           SUB84((ulong)in_stack_fffffffffffffe18 >> 0x20,0));
        if (!bVar1) {
          data_00 = pQVar5;
          entry = in_RSI;
          QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
                    ((QFlags<QFileSystemMetaData::MetaDataFlag> *)in_RSI,in_stack_fffffffffffffe0c);
          fillMetaData(entry,data_00,(MetaDataFlags)what.i);
          in_stack_fffffffffffffe10 = in_RSI;
          in_stack_fffffffffffffe18 = pQVar5;
        }
        bVar1 = QFileSystemMetaData::isDirectory((QFileSystemMetaData *)0x16b65f);
        if ((bVar1) &&
           (pcVar4 = QByteArray::operator[]
                               ((QByteArray *)
                                CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                                0x16b679), *pcVar4 != '/')) {
          local_f8 = 0xaaaaaaaaaaaaaaaa;
          QFileSystemEntry::filePath((QFileSystemEntry *)in_stack_fffffffffffffe18);
          QDir::QDir((QDir *)this,&in_RDI->m_filePath);
          QString::~QString((QString *)0x16b6c8);
          QDir::cdUp((QDir *)in_RDX);
          QDir::path((QDir *)in_stack_fffffffffffffe18);
          QString::operator=(&in_stack_fffffffffffffe10->m_filePath,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          QString::~QString((QString *)0x16b70c);
          bVar1 = QString::isEmpty((QString *)0x16b719);
          if (!bVar1) {
            QChar::QChar<char16_t,_true>(local_12a,L'/');
            bVar1 = QString::endsWith((QString *)in_stack_fffffffffffffe18,
                                      (QChar)(char16_t)((ulong)in_RDI >> 0x30),
                                      (CaseSensitivity)((ulong)in_stack_fffffffffffffe10 >> 0x20));
            if (!bVar1) {
              QChar::QChar<char16_t,_true>(&local_12c,L'/');
              QString::operator+=(&in_stack_fffffffffffffe10->m_filePath,
                                  (QChar)(char16_t)((ulong)in_stack_fffffffffffffe18 >> 0x30));
            }
          }
          QDir::~QDir((QDir *)0x16b781);
        }
        c.ucs = (char16_t)((ulong)in_RDI >> 0x30);
        QFile::decodeName((QByteArray *)
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        QString::operator+=(&in_stack_fffffffffffffe10->m_filePath,
                            (QString *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                           );
        QString::~QString((QString *)0x16b7b8);
        QChar::QChar<char16_t,_true>(local_14a,L'/');
        bVar1 = QString::startsWith((QString *)in_stack_fffffffffffffe18,c,
                                    (CaseSensitivity)((ulong)in_stack_fffffffffffffe10 >> 0x20));
        if (!bVar1) {
          absoluteName((QFileSystemEntry *)in_RDX);
          QFileSystemEntry::path((QFileSystemEntry *)in_stack_fffffffffffffe18);
          local_182 = 0x2f;
          ::operator+((QString *)in_stack_fffffffffffffe18,(char16_t *)in_stack_fffffffffffffe10);
          QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString,_char16_t> *)
                     CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          QString::prepend(&in_stack_fffffffffffffe10->m_filePath,
                           (QString *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08))
          ;
          QString::~QString((QString *)0x16b865);
          QStringBuilder<QString,_char16_t>::~QStringBuilder
                    ((QStringBuilder<QString,_char16_t> *)0x16b872);
          QString::~QString((QString *)0x16b87c);
          QFileSystemEntry::~QFileSystemEntry(in_stack_fffffffffffffe10);
        }
        QDir::cleanPath((QString *)in_stack_fffffffffffffe18);
        QString::operator=(&in_stack_fffffffffffffe10->m_filePath,
                           (QString *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08))
        ;
        QString::~QString((QString *)0x16b8b7);
        qVar3 = QString::size((QString *)&stack0xffffffffffffff18);
        if (1 < qVar3) {
          QChar::QChar<char16_t,_true>(local_1a2,L'/');
          bVar1 = QString::endsWith((QString *)in_stack_fffffffffffffe18,c,
                                    (CaseSensitivity)((ulong)in_stack_fffffffffffffe10 >> 0x20));
          if (bVar1) {
            QString::chop(&in_stack_fffffffffffffe10->m_filePath,
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          }
        }
        QFileSystemEntry::QFileSystemEntry
                  (in_stack_fffffffffffffe10,
                   (QString *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        QString::~QString((QString *)0x16b92f);
      }
      QByteArray::~QByteArray((QByteArray *)0x16b950);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::getLinkTarget(const QFileSystemEntry &link, QFileSystemMetaData &data)
{
    Q_CHECK_FILE_NAME(link, link);

    QByteArray s = qt_readlink(link.nativeFilePath().constData());
    if (s.size() > 0) {
        QString ret;
        if (!data.hasFlags(QFileSystemMetaData::DirectoryType))
            fillMetaData(link, data, QFileSystemMetaData::DirectoryType);
        if (data.isDirectory() && s[0] != '/') {
            QDir parent(link.filePath());
            parent.cdUp();
            ret = parent.path();
            if (!ret.isEmpty() && !ret.endsWith(u'/'))
                ret += u'/';
        }
        ret += QFile::decodeName(s);

        if (!ret.startsWith(u'/'))
            ret.prepend(absoluteName(link).path() + u'/');
        ret = QDir::cleanPath(ret);
        if (ret.size() > 1 && ret.endsWith(u'/'))
            ret.chop(1);
        return QFileSystemEntry(ret);
    }
#if defined(Q_OS_DARWIN)
    {
        QCFString path = CFStringCreateWithFileSystemRepresentation(0,
            QFile::encodeName(QDir::cleanPath(link.filePath())).data());
        if (!path)
            return QFileSystemEntry();

        QCFType<CFURLRef> url = CFURLCreateWithFileSystemPath(0, path, kCFURLPOSIXPathStyle,
            data.hasFlags(QFileSystemMetaData::DirectoryType));
        if (!url)
            return QFileSystemEntry();

        QCFType<CFDataRef> bookmarkData = CFURLCreateBookmarkDataFromFile(0, url, NULL);
        if (!bookmarkData)
            return QFileSystemEntry();

        QCFType<CFURLRef> resolvedUrl = CFURLCreateByResolvingBookmarkData(0,
            bookmarkData,
            (CFURLBookmarkResolutionOptions)(kCFBookmarkResolutionWithoutUIMask
                | kCFBookmarkResolutionWithoutMountingMask), NULL, NULL, NULL, NULL);
        if (!resolvedUrl)
            return QFileSystemEntry();

        QCFString cfstr(CFURLCopyFileSystemPath(resolvedUrl, kCFURLPOSIXPathStyle));
        if (!cfstr)
            return QFileSystemEntry();

        return QFileSystemEntry(QString::fromCFString(cfstr));
    }
#endif
    return QFileSystemEntry();
}